

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlrelationaltablemodel.cpp
# Opt level: O1

void __thiscall QRelation::populateModel(QRelation *this)

{
  QObject *parent;
  QRelatedTableModel *pQVar1;
  undefined4 *puVar2;
  long in_FS_OFFSET;
  bool bVar3;
  QObject local_68 [8];
  QObject local_60 [8];
  QObject local_58 [8];
  undefined1 local_50 [8];
  undefined8 local_48;
  qsizetype local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->rel).tName.d.size == 0) || ((this->rel).iColumn.d.size == 0)) {
    bVar3 = false;
  }
  else {
    bVar3 = (this->rel).dColumn.d.size != 0;
  }
  parent = (QObject *)this->m_parent;
  if (((bool)(parent != (QObject *)0x0 & bVar3)) && (this->model == (QRelatedTableModel *)0x0)) {
    pQVar1 = (QRelatedTableModel *)operator_new(0x20);
    QSqlTableModel::database((QSqlTableModel *)local_50);
    QSqlTableModel::QSqlTableModel((QSqlTableModel *)pQVar1,parent,(QSqlDatabase *)local_50);
    *(undefined ***)&(pQVar1->super_QSqlTableModel).super_QSqlQueryModel = &PTR_metaObject_0014f888;
    pQVar1->firstSelect = true;
    pQVar1->relation = this;
    this->model = pQVar1;
    QSqlDatabase::~QSqlDatabase((QSqlDatabase *)local_50);
    pQVar1 = this->model;
    local_50 = (undefined1  [8])(this->rel).tName.d.d;
    local_48 = (this->rel).tName.d.ptr;
    local_40 = (this->rel).tName.d.size;
    if (local_50 != (undefined1  [8])0x0) {
      LOCK();
      (((QArrayData *)&((QArrayData *)local_50)->ref_)->ref_)._q_value.super___atomic_base<int>._M_i
           = (((QArrayData *)&((QArrayData *)local_50)->ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    (**(code **)(*(long *)&(pQVar1->super_QSqlTableModel).super_QSqlQueryModel + 0x1a0))
              (pQVar1,local_50);
    if (local_50 != (undefined1  [8])0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_50)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_50)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_50)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_50,2,0x10);
      }
    }
    (**(code **)(*(long *)&(this->model->super_QSqlTableModel).super_QSqlQueryModel + 0x1c8))();
    pQVar1 = this->model;
    local_50 = (undefined1  [8])QAbstractItemModel::dataChanged;
    local_48 = (char16_t *)0x0;
    puVar2 = (undefined4 *)operator_new(0x18);
    *puVar2 = 1;
    *(code **)(puVar2 + 2) =
         QtPrivate::
         QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/sql/models/qsqlrelationaltablemodel.cpp:160:74),_QtPrivate::List<const_QModelIndex_&,_const_QModelIndex_&>,_void>
         ::impl;
    *(QRelation **)(puVar2 + 4) = this;
    QObject::connectImpl
              (local_58,(void **)pQVar1,(QObject *)local_50,(void **)pQVar1,(QSlotObjectBase *)0x0,
               (ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_58);
    pQVar1 = this->model;
    local_50 = (undefined1  [8])QAbstractItemModel::rowsRemoved;
    local_48 = (char16_t *)0x0;
    puVar2 = (undefined4 *)operator_new(0x18);
    *puVar2 = 1;
    *(code **)(puVar2 + 2) =
         QtPrivate::
         QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/sql/models/qsqlrelationaltablemodel.cpp:165:74),_QtPrivate::List<>,_void>
         ::impl;
    *(QRelation **)(puVar2 + 4) = this;
    QObject::connectImpl
              (local_60,(void **)pQVar1,(QObject *)local_50,(void **)pQVar1,(QSlotObjectBase *)0x0,
               (ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_60);
    pQVar1 = this->model;
    local_50 = (undefined1  [8])QAbstractItemModel::rowsInserted;
    local_48 = (char16_t *)0x0;
    puVar2 = (undefined4 *)operator_new(0x18);
    *puVar2 = 1;
    *(code **)(puVar2 + 2) =
         QtPrivate::
         QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/sql/models/qsqlrelationaltablemodel.cpp:169:75),_QtPrivate::List<>,_void>
         ::impl;
    *(QRelation **)(puVar2 + 4) = this;
    QObject::connectImpl
              (local_68,(void **)pQVar1,(QObject *)local_50,(void **)pQVar1,(QSlotObjectBase *)0x0,
               (ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRelation::populateModel()
{
    if (!isValid())
        return;
    Q_ASSERT(m_parent != nullptr);

    if (!model) {
        model = new QRelatedTableModel(this, m_parent, m_parent->database());
        model->setTable(rel.tableName());
        model->select();
        QObject::connect(model, &QAbstractItemModel::dataChanged, model, [&](const QModelIndex &tl, const QModelIndex &br)
        {
            if (tl.column() >= col && br.column() <= col)
                clearDictionary();
        });
        QObject::connect(model, &QAbstractItemModel::rowsRemoved, model, [&]()
        {
            clearDictionary();
        });
        QObject::connect(model, &QAbstractItemModel::rowsInserted, model, [&]()
        {
            clearDictionary();
        });
    }
}